

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::num_writer::operator()
          (num_writer *this,char **it)

{
  uint value;
  int num_digits;
  add_thousands_sep<char> sep;
  basic_string_view<char> sep_00;
  char *pcVar1;
  add_thousands_sep<char> local_40;
  undefined1 local_28 [8];
  basic_string_view<char> s;
  char **it_local;
  num_writer *this_local;
  
  s.size_ = (size_t)it;
  basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)local_28,(char *)(this + 8),1);
  pcVar1 = *(char **)s.size_;
  value = *(uint *)this;
  num_digits = *(int *)(this + 4);
  sep_00.size_ = (size_t)s.data_;
  sep_00.data_ = (char *)local_28;
  internal::add_thousands_sep<char>::add_thousands_sep(&local_40,sep_00);
  sep.sep_.size_ = local_40.sep_.size_;
  sep.sep_.data_ = local_40.sep_.data_;
  sep.digit_index_ = local_40.digit_index_;
  sep._20_4_ = local_40._20_4_;
  pcVar1 = internal::
           format_decimal<char,unsigned_int,char*,fmt::v5::internal::add_thousands_sep<char>>
                     (pcVar1,value,num_digits,sep);
  *(char **)s.size_ = pcVar1;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = internal::format_decimal<char_type>(
              it, abs_value, size, internal::add_thousands_sep<char_type>(s));
      }